

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O1

_Bool enchant(object *obj,wchar_t n,wchar_t eflag)

{
  byte *pbVar1;
  byte bVar2;
  object *poVar3;
  player_upkeep *ppVar4;
  _Bool _Var5;
  uint32_t uVar6;
  bool bVar7;
  int iVar8;
  uint m;
  bool bVar9;
  
  bVar2 = obj->number;
  _Var5 = tval_is_ammo(obj);
  iVar8 = 100;
  if (_Var5) {
    iVar8 = 5;
  }
  if (n < L'\x01') {
    bVar7 = false;
  }
  else {
    m = iVar8 * (uint)bVar2;
    bVar7 = false;
    do {
      if ((m < 0x65) || (uVar6 = Rand_div(m), (int)uVar6 < 100)) {
        bVar9 = true;
        if (((eflag & 1U) != 0) && (_Var5 = enchant2(obj,&obj->to_h), _Var5)) {
          bVar7 = bVar9;
        }
        if (((eflag & 2U) != 0) && (_Var5 = enchant2(obj,&obj->to_d), _Var5)) {
          bVar7 = bVar9;
        }
        if (((eflag & 4U) != 0) && (_Var5 = enchant2(obj,&obj->to_a), _Var5)) {
          bVar7 = bVar9;
        }
      }
      n = n + L'\xffffffff';
    } while (n != L'\0');
  }
  poVar3 = obj->known;
  if (poVar3 == (object *)0x0) {
    __assert_fail("obj->known",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/effect-handler-general.c"
                  ,0x159,"_Bool enchant(struct object *, int, int)");
  }
  poVar3->to_h = obj->to_h;
  poVar3->to_d = obj->to_d;
  poVar3->to_a = obj->to_a;
  if (bVar7) {
    ppVar4 = player->upkeep;
    ppVar4->update = ppVar4->update | 0x401;
    *(byte *)&ppVar4->notice = (byte)ppVar4->notice | 1;
    pbVar1 = (byte *)((long)&ppVar4->redraw + 2);
    *pbVar1 = *pbVar1 | 6;
  }
  return bVar7;
}

Assistant:

static bool enchant(struct object *obj, int n, int eflag)
{
	int i, prob;
	bool res = false;

	/* Large piles resist enchantment */
	prob = obj->number * 100;

	/* Missiles are easy to enchant */
	if (tval_is_ammo(obj)) prob = prob / 20;

	/* Try "n" times */
	for (i = 0; i < n; i++)
	{
		/* Roll for pile resistance */
		if (prob > 100 && randint0(prob) >= 100) continue;

		/* Try the three kinds of enchantment we can do */
		if ((eflag & ENCH_TOHIT) && enchant2(obj, &obj->to_h)) res = true;
		if ((eflag & ENCH_TODAM) && enchant2(obj, &obj->to_d)) res = true;
		if ((eflag & ENCH_TOAC)  && enchant2(obj, &obj->to_a)) res = true;
	}

	/* Update knowledge */
	assert(obj->known);
	obj->known->to_h = obj->to_h;
	obj->known->to_d = obj->to_d;
	obj->known->to_a = obj->to_a;

	/* Failure */
	if (!res) return (false);

	/* Recalculate bonuses, gear */
	player->upkeep->update |= (PU_BONUS | PU_INVEN);

	/* Combine the pack (later) */
	player->upkeep->notice |= (PN_COMBINE);

	/* Redraw stuff */
	player->upkeep->redraw |= (PR_INVEN | PR_EQUIP );

	/* Success */
	return (true);
}